

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdnslookup_p.cpp
# Opt level: O2

void * __thiscall QDnsLookupRunnable::qt_metacast(QDnsLookupRunnable *this,char *_clname)

{
  int iVar1;
  void *pvVar2;
  
  if (_clname == (char *)0x0) {
    this = (QDnsLookupRunnable *)0x0;
  }
  else {
    iVar1 = strcmp(_clname,qt_staticMetaObjectStaticContent<(anonymous_namespace)::qt_meta_tag_ZN18QDnsLookupRunnableE_t>
                           .strings);
    if (iVar1 != 0) {
      iVar1 = strcmp(_clname,"QRunnable");
      if (iVar1 != 0) {
        pvVar2 = (void *)QObject::qt_metacast((char *)this);
        return pvVar2;
      }
      this = (QDnsLookupRunnable *)&this->super_QRunnable;
    }
  }
  return this;
}

Assistant:

void *QDnsLookupRunnable::qt_metacast(const char *_clname)
{
    if (!_clname) return nullptr;
    if (!strcmp(_clname, qt_staticMetaObjectStaticContent<qt_meta_tag_ZN18QDnsLookupRunnableE_t>.strings))
        return static_cast<void*>(this);
    if (!strcmp(_clname, "QRunnable"))
        return static_cast< QRunnable*>(this);
    return QObject::qt_metacast(_clname);
}